

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

void al_insert_path_component(ALLEGRO_PATH *path,int i,char *s)

{
  undefined8 *puVar1;
  ALLEGRO_USTR *pAVar2;
  
  if (i < 0) {
    i = i + (int)(path->segments)._size;
  }
  puVar1 = (undefined8 *)_al_vector_alloc_mid(&path->segments,i);
  pAVar2 = al_ustr_new(s);
  *puVar1 = pAVar2;
  return;
}

Assistant:

void al_insert_path_component(ALLEGRO_PATH *path, int i, const char *s)
{
   ALLEGRO_USTR **slot;
   ASSERT(path);
   ASSERT(i <= (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   slot = _al_vector_alloc_mid(&path->segments, i);
   (*slot) = al_ustr_new(s);
}